

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

bool __thiscall AActor::HasSpecialDeathStates(AActor *this)

{
  int *piVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  PClass *pPVar3;
  
  pPVar3 = (this->super_DThinker).super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)();
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (this->super_DThinker).super_DObject.Class = pPVar3;
  }
  piVar1 = *(int **)&pPVar3[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                     super_PCompoundType.super_PType.Align;
  if (piVar1 != (int *)0x0) {
    uVar5 = 0;
    if (*piVar1 < 1) goto LAB_004551ea;
    iVar2 = *piVar1 + -1;
    do {
      uVar4 = uVar5 + iVar2 >> 1;
      if (piVar1[(ulong)uVar4 * 6 + 2] == 0x8c) {
        piVar1 = *(int **)(piVar1 + (ulong)uVar4 * 6 + 6);
        if ((piVar1 != (int *)0x0) && (0 < (long)*piVar1)) {
          lVar6 = 0;
          goto LAB_004551cf;
        }
        break;
      }
      if (piVar1[(ulong)uVar4 * 6 + 2] < 0x8c) {
        uVar5 = uVar4 + 1;
      }
      else {
        iVar2 = uVar4 - 1;
      }
    } while ((int)uVar5 <= iVar2);
  }
  uVar5 = 0;
  goto LAB_004551ea;
  while (bVar7 = (long)*piVar1 * 0x18 + -0x18 != lVar6, lVar6 = lVar6 + 0x18, bVar7) {
LAB_004551cf:
    bVar7 = *(long *)((long)piVar1 + lVar6 + 0x10) != 0;
    uVar5 = (uint)bVar7;
    if (bVar7) break;
  }
LAB_004551ea:
  return SUB41(uVar5,0);
}

Assistant:

FStateLabels *FStateDefinitions::CreateStateLabelList(TArray<FStateDefine> & statelist)
{
	// First delete all empty labels from the list
	for (int i = statelist.Size() - 1; i >= 0; i--)
	{
		if (statelist[i].Label == NAME_None || (statelist[i].State == NULL && statelist[i].Children.Size() == 0))
		{
			statelist.Delete(i);
		}
	}

	int count = statelist.Size();

	if (count == 0)
	{
		return NULL;
	}
	FStateLabels *list = (FStateLabels*)M_Malloc(sizeof(FStateLabels)+(count-1)*sizeof(FStateLabel));
	list->NumLabels = count;

	for (int i=0;i<count;i++)
	{
		list->Labels[i].Label = statelist[i].Label;
		list->Labels[i].State = statelist[i].State;
		list->Labels[i].Children = CreateStateLabelList(statelist[i].Children);
	}
	qsort(list->Labels, count, sizeof(FStateLabel), labelcmp);
	return list;
}